

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,StringLiteralNode *node)

{
  pointer pcVar1;
  Value *pVVar2;
  Value *pVVar3;
  
  pVVar3 = (Value *)operator_new(0x30);
  pVVar3->valueType_ = String;
  pVVar3->_vptr_Value = (_func_int **)&PTR__String_00150bf0;
  pVVar3[1]._vptr_Value = (_func_int **)(pVVar3 + 2);
  pcVar1 = (node->value_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pVVar3 + 1),pcVar1,pcVar1 + (node->value_)._M_string_length);
  pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
  super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.super__Head_base<0UL,_Value_*,_false>
  ._M_head_impl = pVVar3;
  if (pVVar2 != (Value *)0x0) {
    (*pVVar2->_vptr_Value[1])();
    return;
  }
  return;
}

Assistant:

void Executor::visit(const StringLiteralNode& node)
{
  value_ = std::make_unique<String>(node.getValue());
}